

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::computeFactor(HModel *this)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = HTimer::getTime(&this->timer);
  HFactor::build(&this->factor);
  this->countUpdate = 0;
  dVar3 = HTimer::getTime(&this->timer);
  uVar1 = this->totalInverts + 1;
  this->totalInverts = uVar1;
  this->totalInvertTime = this->totalInvertTime + (dVar3 - dVar2);
  printf("           INVERT  %4d     on iteration %9d: INVERT  time = %11.4g; Total INVERT  time = %11.4g\n"
         ,(ulong)uVar1,(ulong)(uint)this->numberIteration);
  this->mlFg_haveInvert = 1;
  this->mlFg_haveFreshInvert = 1;
  return;
}

Assistant:

void HModel::computeFactor() {
#ifdef JAJH_dev
  //	double tt0 = timer.getTime();
#endif
	double tt0 = timer.getTime();
    try {
        factor.build();
    } catch (runtime_error& error) {
        cout << error.what() << endl;
        problemStatus = LP_Status_Singular;
        // TODO Change to return
#ifdef JAJH_dev
        writePivots("failed");
#endif
        exit(0);
    }
    //    printf("INVERT: After %d iterations and %d updates\n", numberIteration, countUpdate);
    countUpdate = 0;

    double invertTime = timer.getTime()-tt0;
    totalInverts++;
    totalInvertTime += invertTime;
#ifdef JAJH_dev
    printf("           INVERT  %4d     on iteration %9d: INVERT  time = %11.4g; Total INVERT  time = %11.4g\n",
	   totalInverts, numberIteration, invertTime, totalInvertTime);
#endif

    //Now have a representation of B^{-1}, and it is fresh!
    mlFg_haveInvert = 1;
    mlFg_haveFreshInvert = 1;
}